

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O0

MppMetaImpl * __thiscall MppMetaService::get_meta(MppMetaService *this,char *tag,char *caller)

{
  RK_U32 *pRVar1;
  RK_U32 RVar2;
  MppMetaImpl *__dest;
  char *pcVar3;
  char *local_48;
  uint local_34;
  RK_U32 i;
  char *tag_src;
  MppMetaImpl *impl;
  char *caller_local;
  char *tag_local;
  MppMetaService *this_local;
  
  __dest = (MppMetaImpl *)mpp_osal_malloc("get_meta",0x318);
  if (__dest == (MppMetaImpl *)0x0) {
    _mpp_log_l(2,"mpp_meta","failed to malloc meta data\n","get_meta");
  }
  else {
    local_48 = tag;
    if (tag == (char *)0x0) {
      local_48 = "mpp_meta";
    }
    strncpy((char *)__dest,local_48,0x1f);
    __dest->caller = caller;
    LOCK();
    pRVar1 = &this->meta_id;
    RVar2 = *pRVar1;
    *pRVar1 = *pRVar1 + 1;
    UNLOCK();
    __dest->meta_id = RVar2;
    (__dest->list_meta).next = &__dest->list_meta;
    (__dest->list_meta).prev = &__dest->list_meta;
    __dest->ref_count = 1;
    __dest->node_count = 0;
    for (local_34 = 0; local_34 < 0x2d; local_34 = local_34 + 1) {
      pcVar3 = __dest[1].tag + (ulong)local_34 * 0x10;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
    }
    mpp_spinlock_lock(&this->mLock);
    list_add_tail(&__dest->list_meta,&this->mlist_meta);
    mpp_spinlock_unlock(&this->mLock);
    LOCK();
    this->meta_count = this->meta_count + 1;
    UNLOCK();
  }
  return __dest;
}

Assistant:

MppMetaImpl *MppMetaService::get_meta(const char *tag, const char *caller)
{
    MppMetaImpl *impl = mpp_malloc_size(MppMetaImpl, sizeof(MppMetaImpl) +
                                        sizeof(MppMetaVal) * MPP_ARRAY_ELEMS(meta_defs));
    if (impl) {
        const char *tag_src = (tag) ? (tag) : (MODULE_TAG);
        RK_U32 i;

        strncpy(impl->tag, tag_src, sizeof(impl->tag) - 1);
        impl->caller = caller;
        impl->meta_id = MPP_FETCH_ADD(&meta_id, 1);
        INIT_LIST_HEAD(&impl->list_meta);
        impl->ref_count = 1;
        impl->node_count = 0;

        for (i = 0; i < MPP_ARRAY_ELEMS(meta_defs); i++)
            impl->vals[i].state = 0;

        mpp_spinlock_lock(&mLock);
        list_add_tail(&impl->list_meta, &mlist_meta);
        mpp_spinlock_unlock(&mLock);
        MPP_FETCH_ADD(&meta_count, 1);
    } else {
        mpp_err_f("failed to malloc meta data\n");
    }
    return impl;
}